

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::SharedDtor(SentencePieceText_SentencePiece *this)

{
  void *pvVar1;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (pvVar1 != (void *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,"src/builtin_pb/sentencepiece.pb.cc",0x8c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->piece_,(string *)&google::protobuf::internal::fixed_address_empty_string);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->surface_,(string *)&google::protobuf::internal::fixed_address_empty_string);
  return;
}

Assistant:

void SentencePieceText_SentencePiece::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  piece_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  surface_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}